

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void __thiscall sf2cute::RIFF::RIFF(RIFF *this,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  RIFF *this_local;
  
  this->_vptr_RIFF = (_func_int **)&PTR__RIFF_00163950;
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->name_);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ::vector(&this->chunks_);
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  set_name(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

RIFF::RIFF(std::string name) {
  set_name(std::move(name));
}